

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O3

OPJ_BOOL opj_t2_encode_packets
                   (opj_t2_t *p_t2,OPJ_UINT32 p_tile_no,opj_tcd_tile_t *p_tile,
                   OPJ_UINT32 p_maxlayers,OPJ_BYTE *p_dest,OPJ_UINT32 *p_data_written,
                   OPJ_UINT32 p_max_len,opj_codestream_info_t *cstr_info,OPJ_UINT32 p_tp_num,
                   OPJ_INT32 p_tp_pos,OPJ_UINT32 p_pino,J2K_T2_MODE p_t2_mode)

{
  uint uVar1;
  int iVar2;
  OPJ_BOOL OVar3;
  undefined8 uVar4;
  OPJ_UINT32 *pOVar5;
  OPJ_UINT32 OVar6;
  opj_packet_info_t *poVar7;
  opj_tcp_t *tcp;
  opj_pi_iterator_t *poVar8;
  long lVar9;
  OPJ_UINT32 l_comp_len;
  uint uVar10;
  OPJ_BOOL local_7c;
  OPJ_UINT32 local_74;
  opj_pi_iterator_t *local_70;
  uint local_64;
  OPJ_UINT32 local_60;
  OPJ_UINT16 local_5a;
  opj_cp_t *local_58;
  OPJ_UINT32 *local_50;
  opj_tcd_tile_t *local_48;
  undefined4 local_3c;
  OPJ_UINT32 local_38;
  uint local_34;
  
  local_58 = p_t2->cp;
  tcp = local_58->tcps + p_tile_no;
  if ((local_58->m_specific_param).m_dec.m_reduce == 0) {
    local_60 = 1;
  }
  else {
    local_60 = p_t2->image->numcomps;
  }
  local_5a = local_58->rsiz;
  OVar6 = tcp->numpocs;
  local_50 = p_data_written;
  local_48 = p_tile;
  local_70 = opj_pi_initialise_encode(p_t2->image,local_58,p_tile_no,p_t2_mode);
  if (local_70 == (opj_pi_iterator_t *)0x0) {
    local_7c = 0;
  }
  else {
    local_38 = OVar6 + 1;
    *local_50 = 0;
    if (p_t2_mode == THRESH_CALC) {
      if (local_60 == 0) {
        local_7c = 1;
      }
      else {
        local_64 = 0;
        pOVar5 = local_50;
        do {
          uVar4 = CONCAT71((int7)((ulong)pOVar5 >> 8),1);
          uVar10 = 0;
          OVar6 = 0;
          poVar8 = local_70;
          do {
            local_3c = (undefined4)uVar4;
            opj_pi_create_encode(local_70,local_58,p_tile_no,OVar6,local_64,p_tp_pos,THRESH_CALC);
            local_7c = 0;
            if ((poVar8->poc).prg == OPJ_PROG_UNKNOWN) goto LAB_00123418;
            while (OVar3 = opj_pi_next(poVar8), OVar3 != 0) {
              if (poVar8->layno < p_maxlayers) {
                local_74 = 0;
                OVar3 = opj_t2_encode_packet
                                  (p_tile_no,local_48,tcp,poVar8,p_dest,&local_74,p_max_len,
                                   cstr_info);
                if (OVar3 == 0) goto LAB_00123418;
                uVar10 = uVar10 + local_74;
                p_dest = p_dest + local_74;
                p_max_len = p_max_len - local_74;
                *local_50 = *local_50 + local_74;
              }
            }
            uVar1 = (local_58->m_specific_param).m_dec.m_reduce;
            if ((uVar1 != 0) && (uVar1 < uVar10)) goto LAB_00123418;
            poVar8 = poVar8 + 1;
            OVar6 = 1;
            uVar4 = 0;
          } while (((byte)local_3c & local_5a == 4) != 0);
          local_64 = local_64 + 1;
          pOVar5 = (OPJ_UINT32 *)(ulong)local_64;
          local_7c = 1;
        } while (local_64 != local_60);
      }
    }
    else {
      opj_pi_create_encode(local_70,local_58,p_tile_no,p_pino,p_tp_num,p_tp_pos,p_t2_mode);
      local_7c = 0;
      if (local_70[p_pino].poc.prg != OPJ_PROG_UNKNOWN) {
        poVar8 = local_70 + p_pino;
        iVar2 = opj_pi_next(poVar8);
        OVar6 = p_maxlayers;
        uVar10 = local_34;
        while (local_34 = OVar6, iVar2 != 0) {
          if (poVar8->layno < p_maxlayers) {
            local_74 = 0;
            OVar3 = opj_t2_encode_packet
                              (p_tile_no,local_48,tcp,poVar8,p_dest,&local_74,p_max_len,cstr_info);
            if (OVar3 == 0) goto LAB_00123418;
            *local_50 = *local_50 + local_74;
            if (cstr_info != (opj_codestream_info_t *)0x0) {
              iVar2 = cstr_info->packno;
              if (cstr_info->index_write != 0) {
                poVar7 = cstr_info->tile[p_tile_no].packet + iVar2;
                if (iVar2 == 0) {
                  lVar9 = (long)cstr_info->tile[p_tile_no].end_header;
LAB_001233c5:
                  lVar9 = lVar9 + 1;
                }
                else if (((((byte)tcp->field_0x1638 >> 2 |
                           *(byte *)((long)&local_58->m_specific_param + 0x11) >> 3) & 1) == 0) ||
                        (lVar9 = poVar7->start_pos, lVar9 == 0)) {
                  lVar9 = poVar7[-1].end_pos;
                  goto LAB_001233c5;
                }
                poVar7->start_pos = lVar9;
                poVar7->end_pos = (ulong)local_74 + lVar9 + -1;
                poVar7->end_ph_pos = lVar9 + poVar7->end_ph_pos + -1;
              }
              cstr_info->packno = iVar2 + 1;
            }
            p_dest = p_dest + local_74;
            p_max_len = p_max_len - local_74;
            local_48->packno = local_48->packno + 1;
            p_maxlayers = local_34;
          }
          iVar2 = opj_pi_next(poVar8);
          OVar6 = local_34;
          uVar10 = local_34;
        }
        local_7c = 1;
        local_34 = uVar10;
      }
    }
LAB_00123418:
    opj_pi_destroy(local_70,local_38);
  }
  return local_7c;
}

Assistant:

OPJ_BOOL opj_t2_encode_packets( opj_t2_t* p_t2,
                                OPJ_UINT32 p_tile_no,
                                opj_tcd_tile_t *p_tile,
                                OPJ_UINT32 p_maxlayers,
                                OPJ_BYTE *p_dest,
                                OPJ_UINT32 * p_data_written,
                                OPJ_UINT32 p_max_len,
                                opj_codestream_info_t *cstr_info,
                                OPJ_UINT32 p_tp_num,
                                OPJ_INT32 p_tp_pos,
                                OPJ_UINT32 p_pino,
                                J2K_T2_MODE p_t2_mode)
{
        OPJ_BYTE *l_current_data = p_dest;
        OPJ_UINT32 l_nb_bytes = 0;
        OPJ_UINT32 compno;
        OPJ_UINT32 poc;
        opj_pi_iterator_t *l_pi = 00;
        opj_pi_iterator_t *l_current_pi = 00;
        opj_image_t *l_image = p_t2->image;
        opj_cp_t *l_cp = p_t2->cp;
        opj_tcp_t *l_tcp = &l_cp->tcps[p_tile_no];
        OPJ_UINT32 pocno = (l_cp->rsiz == OPJ_PROFILE_CINEMA_4K)? 2: 1;
        OPJ_UINT32 l_max_comp = l_cp->m_specific_param.m_enc.m_max_comp_size > 0 ? l_image->numcomps : 1;
        OPJ_UINT32 l_nb_pocs = l_tcp->numpocs + 1;

        l_pi = opj_pi_initialise_encode(l_image, l_cp, p_tile_no, p_t2_mode);
        if (!l_pi) {
                return OPJ_FALSE;
        }

        * p_data_written = 0;

        if (p_t2_mode == THRESH_CALC ){ /* Calculating threshold */
                l_current_pi = l_pi;

                for     (compno = 0; compno < l_max_comp; ++compno) {
                        OPJ_UINT32 l_comp_len = 0;
                        l_current_pi = l_pi;

                        for (poc = 0; poc < pocno ; ++poc) {
                                OPJ_UINT32 l_tp_num = compno;

                                /* TODO MSD : check why this function cannot fail (cf. v1) */
                                opj_pi_create_encode(l_pi, l_cp,p_tile_no,poc,l_tp_num,p_tp_pos,p_t2_mode);

                                if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
                                    /* TODO ADE : add an error */
                                    opj_pi_destroy(l_pi, l_nb_pocs);
                                    return OPJ_FALSE;
                                }
                                while (opj_pi_next(l_current_pi)) {
                                        if (l_current_pi->layno < p_maxlayers) {
                                                l_nb_bytes = 0;

                                                if (! opj_t2_encode_packet(p_tile_no,p_tile, l_tcp, l_current_pi, l_current_data, &l_nb_bytes, p_max_len, cstr_info)) {
                                                        opj_pi_destroy(l_pi, l_nb_pocs);
                                                        return OPJ_FALSE;
                                                }

                                                l_comp_len += l_nb_bytes;
                                                l_current_data += l_nb_bytes;
                                                p_max_len -= l_nb_bytes;

                                                * p_data_written += l_nb_bytes;
                                        }
                                }

                                if (l_cp->m_specific_param.m_enc.m_max_comp_size) {
                                        if (l_comp_len > l_cp->m_specific_param.m_enc.m_max_comp_size) {
                                                opj_pi_destroy(l_pi, l_nb_pocs);
                                                return OPJ_FALSE;
                                        }
                                }

                                ++l_current_pi;
                        }
                }
        }
        else {  /* t2_mode == FINAL_PASS  */
                opj_pi_create_encode(l_pi, l_cp,p_tile_no,p_pino,p_tp_num,p_tp_pos,p_t2_mode);

                l_current_pi = &l_pi[p_pino];
                if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
                    /* TODO ADE : add an error */
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }
                while (opj_pi_next(l_current_pi)) {
                        if (l_current_pi->layno < p_maxlayers) {
                                l_nb_bytes=0;

                                if (! opj_t2_encode_packet(p_tile_no,p_tile, l_tcp, l_current_pi, l_current_data, &l_nb_bytes, p_max_len, cstr_info)) {
                                        opj_pi_destroy(l_pi, l_nb_pocs);
                                        return OPJ_FALSE;
                                }

                                l_current_data += l_nb_bytes;
                                p_max_len -= l_nb_bytes;

                                * p_data_written += l_nb_bytes;

                                /* INDEX >> */
                                if(cstr_info) {
                                        if(cstr_info->index_write) {
                                                opj_tile_info_t *info_TL = &cstr_info->tile[p_tile_no];
                                                opj_packet_info_t *info_PK = &info_TL->packet[cstr_info->packno];
                                                if (!cstr_info->packno) {
                                                        info_PK->start_pos = info_TL->end_header + 1;
                                                } else {
                                                        info_PK->start_pos = ((l_cp->m_specific_param.m_enc.m_tp_on | l_tcp->POC)&& info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[cstr_info->packno - 1].end_pos + 1;
                                                }
                                                info_PK->end_pos = info_PK->start_pos + l_nb_bytes - 1;
                                                info_PK->end_ph_pos += info_PK->start_pos - 1;  /* End of packet header which now only represents the distance
                                                                                                                                                                                                                                                   to start of packet is incremented by value of start of packet*/
                                        }

                                        cstr_info->packno++;
                                }
                                /* << INDEX */
                                ++p_tile->packno;
                        }
                }
        }

        opj_pi_destroy(l_pi, l_nb_pocs);

        return OPJ_TRUE;
}